

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base.h
# Opt level: O2

void __thiscall
fructose::test_base<TestAdsPerformance>::add_test
          (test_base<TestAdsPerformance> *this,string *name,test_case the_test)

{
  iterator iVar1;
  ostream *poVar2;
  mapped_type *this_00;
  stringstream str;
  test_case local_1f0 [2];
  test_info local_1e0;
  undefined1 local_1a8 [16];
  test_info local_198 [6];
  
  if ((this->m_exceptionPending)._M_string_length == 0) {
    local_1f0[0] = the_test;
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
            ::find(&(this->m_tests)._M_t,name);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->m_tests)._M_t._M_impl.super__Rb_tree_header) {
      test_root::test_info::test_info(&local_1e0,name);
      std::
      pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::
      pair<void_(TestAdsPerformance::*&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info,_true>
                ((pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
                  *)local_1a8,local_1f0,&local_1e0);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
                ::operator[](&this->m_tests,name);
      std::
      pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::operator=(this_00,(type)local_1a8);
      test_root::test_info::~test_info((test_info *)(local_1a8 + 0x10));
      test_root::test_info::~test_info(&local_1e0);
      test_root::test_info::test_info((test_info *)local_1a8,name);
      std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>::
      emplace_back<fructose::test_root::test_info>(&this->m_available_tests,(test_info *)local_1a8);
      test_root::test_info::~test_info((test_info *)local_1a8);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      poVar2 = std::operator<<((ostream *)(local_1a8 + 0x10),"add_test called with test name \'");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::operator<<(poVar2,"\' which has already been added.");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->m_exceptionPending,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    }
  }
  return;
}

Assistant:

inline void 
test_base<test_container>::add_test(const std::string& name, 
                                    test_case the_test)
{
    if (m_exceptionPending.length() > 0)
    {
        return;
    }

    typename std::map<std::string, std::pair<test_case, test_info> >::const_iterator it = m_tests.find(name);
    if (it == m_tests.end())
    {
        m_tests[name] = std::make_pair(the_test, test_info(name));
        m_available_tests.push_back(name);
    }
    else
    {
        std::stringstream str;
        str << "add_test called with test name '" << name
            << "' which has already been added.";
        m_exceptionPending = str.str();
    }
}